

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall xLearn::Reader::SetBlockSize(Reader *this,size_t size)

{
  ostream *poVar1;
  ostream *poVar2;
  ulong in_RSI;
  long in_RDI;
  string *in_stack_ffffffffffffff88;
  string local_70 [4];
  int in_stack_ffffffffffffff94;
  string *in_stack_ffffffffffffff98;
  LogSeverity in_stack_ffffffffffffffa4;
  allocator local_39;
  string local_38 [36];
  Logger local_14;
  ulong local_10;
  
  if (in_RSI == 0) {
    local_10 = in_RSI;
    Logger::Logger(&local_14,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/reader/reader.h"
               ,&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"SetBlockSize",(allocator *)&stack0xffffffffffffff8f);
    poVar1 = Logger::Start(in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,
                           in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
    poVar1 = std::operator<<(poVar1,"CHECK_GT failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/reader/reader.h"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x6c);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"size");
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_10);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar2 = std::operator<<(poVar1,"0");
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    Logger::~Logger((Logger *)poVar1);
    abort();
  }
  *(ulong *)(in_RDI + 200) = in_RSI;
  return;
}

Assistant:

inline void SetBlockSize(size_t size) { 
    CHECK_GT(size, 0);
    block_size_ = size; 
  }